

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextRemoveNode
               (ImGuiContext *ctx,ImGuiDockNode *node,bool merge_sibling_into_parent_node)

{
  undefined4 key;
  ImGuiContext *ctx_00;
  long lVar1;
  byte in_DL;
  long in_RSI;
  ImGuiStorage *in_RDI;
  bool bVar2;
  int n;
  ImGuiDockNode *sibling_node;
  bool merge;
  ImGuiDockNode *parent_node;
  ImGuiDockContext *dc;
  ImGuiContext *g;
  ImGuiDockNode *local_50;
  bool local_45;
  int local_44;
  undefined7 in_stack_ffffffffffffffc8;
  
  key = in_RDI[0x2ec].Data.Capacity;
  if (*(long *)(in_RSI + 0x78) != 0) {
    *(undefined8 *)(*(long *)(in_RSI + 0x78) + 0x418) = 0;
  }
  ctx_00 = *(ImGuiContext **)(in_RSI + 0x10);
  bVar2 = (in_DL & 1) != 0;
  local_45 = bVar2 && ctx_00 != (ImGuiContext *)0x0;
  if (bVar2 && ctx_00 != (ImGuiContext *)0x0) {
    lVar1._0_4_ = (ctx_00->IO).DeltaTime;
    lVar1._4_4_ = (ctx_00->IO).IniSavingRate;
    if (lVar1 == in_RSI) {
      local_50 = (ImGuiDockNode *)(ctx_00->IO).IniFilename;
    }
    else {
      local_50 = *(ImGuiDockNode **)&(ctx_00->IO).DeltaTime;
    }
    DockNodeTreeMerge(ctx_00,(ImGuiDockNode *)CONCAT17(local_45,in_stack_ffffffffffffffc8),local_50)
    ;
  }
  else {
    for (local_44 = 0; ctx_00 != (ImGuiContext *)0x0 && local_44 < 2; local_44 = local_44 + 1) {
      if (*(long *)((ctx_00->IO).KeyMap + (long)local_44 * 2 + -9) == in_RSI) {
        *(undefined8 *)(*(long *)(in_RSI + 0x10) + 0x18 + (long)local_44 * 8) = 0;
      }
    }
    ImGuiStorage::SetVoidPtr(in_RDI,key,ctx_00);
    IM_DELETE<ImGuiDockNode>((ImGuiDockNode *)0x1c99e2);
  }
  return;
}

Assistant:

static void ImGui::DockContextRemoveNode(ImGuiContext* ctx, ImGuiDockNode* node, bool merge_sibling_into_parent_node)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc = ctx->DockContext;

    IMGUI_DEBUG_LOG_DOCKING("DockContextRemoveNode 0x%08X\n", node->ID);
    IM_ASSERT(DockContextFindNodeByID(ctx, node->ID) == node);
    IM_ASSERT(node->ChildNodes[0] == NULL && node->ChildNodes[1] == NULL);
    IM_ASSERT(node->Windows.Size == 0);

    if (node->HostWindow)
        node->HostWindow->DockNodeAsHost = NULL;

    ImGuiDockNode* parent_node = node->ParentNode;
    const bool merge = (merge_sibling_into_parent_node && parent_node != NULL);
    if (merge)
    {
        IM_ASSERT(parent_node->ChildNodes[0] == node || parent_node->ChildNodes[1] == node);
        ImGuiDockNode* sibling_node = (parent_node->ChildNodes[0] == node ? parent_node->ChildNodes[1] : parent_node->ChildNodes[0]);
        DockNodeTreeMerge(&g, parent_node, sibling_node);
    }
    else
    {
        for (int n = 0; parent_node && n < IM_ARRAYSIZE(parent_node->ChildNodes); n++)
            if (parent_node->ChildNodes[n] == node)
                node->ParentNode->ChildNodes[n] = NULL;
        dc->Nodes.SetVoidPtr(node->ID, NULL);
        IM_DELETE(node);
    }
}